

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

size_t __thiscall S2Polygon::SpaceUsed(S2Polygon *this)

{
  int iVar1;
  S2Loop *this_00;
  size_t sVar2;
  int local_1c;
  long lStack_18;
  int i;
  size_t size;
  S2Polygon *this_local;
  
  lStack_18 = 0xd8;
  local_1c = 0;
  while( true ) {
    iVar1 = num_loops(this);
    if (iVar1 <= local_1c) break;
    this_00 = loop(this,local_1c);
    sVar2 = S2Loop::SpaceUsed(this_00);
    lStack_18 = sVar2 + lStack_18;
    local_1c = local_1c + 1;
  }
  sVar2 = MutableS2ShapeIndex::SpaceUsed(&this->index_);
  return (sVar2 - 0x58) + lStack_18;
}

Assistant:

size_t S2Polygon::SpaceUsed() const {
  size_t size = sizeof(*this);
  for (int i = 0; i < num_loops(); ++i) {
    size += loop(i)->SpaceUsed();
  }
  size += index_.SpaceUsed() - sizeof(index_);
  return size;
}